

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::App::set_help_all_flag(App *this,string *name,string *description)

{
  Option *pOVar1;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string local_58;
  string local_38;
  
  if (this->help_all_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_all_ptr_);
    this->help_all_ptr_ = (Option *)0x0;
  }
  if (name->_M_string_length == 0) {
    pOVar1 = (Option *)0x0;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_38,(string *)name);
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/benjaminkiesl[P]ut_tamarin/third-party/cli11/CLI11.hpp:2510:53)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/benjaminkiesl[P]ut_tamarin/third-party/cli11/CLI11.hpp:2510:53)>
               ::_M_manager;
    ::std::__cxx11::string::string((string *)&local_58,(string *)description);
    pOVar1 = add_flag_function(this,&local_38,(function<void_(unsigned_long)> *)&local_78,&local_58)
    ;
    this->help_all_ptr_ = pOVar1;
    ::std::__cxx11::string::~string((string *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_38);
    pOVar1 = this->help_all_ptr_;
    pOVar1->short_circuit_ = true;
    (pOVar1->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar1;
}

Assistant:

Option *set_help_all_flag(std::string name = "", std::string description = "") {
        if(help_all_ptr_ != nullptr) {
            remove_option(help_all_ptr_);
            help_all_ptr_ = nullptr;
        }

        // Empty name will simply remove the help all flag
        if(!name.empty()) {
            help_all_ptr_ = add_flag_function(name, [](size_t) -> void { throw CallForAllHelp(); }, description);
            help_all_ptr_->short_circuit(true);
            help_all_ptr_->configurable(false);
        }

        return help_all_ptr_;
    }